

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qsyntaxhighlighter.cpp
# Opt level: O0

void __thiscall
QSyntaxHighlighterPrivate::rehighlight
          (QSyntaxHighlighterPrivate *this,QTextCursor *cursor,MoveOperation operation)

{
  long lVar1;
  int charsRemoved;
  undefined8 in_RDI;
  long in_FS_OFFSET;
  int from;
  QScopedValueRollback<bool> bg;
  QTextCursor *in_stack_ffffffffffffffa8;
  undefined4 in_stack_ffffffffffffffb0;
  undefined4 uVar2;
  int charsAdded;
  int from_00;
  QSyntaxHighlighterPrivate *this_00;
  int n;
  undefined1 *puVar3;
  QTextCursor *this_01;
  
  n = (int)((ulong)in_RDI >> 0x20);
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  puVar3 = &DAT_aaaaaaaaaaaaaaaa;
  this_01 = (QTextCursor *)&DAT_aaaaaaaaaaaaaaaa;
  this_00 = (QSyntaxHighlighterPrivate *)&stack0xffffffffffffffe8;
  uVar2 = 1;
  charsAdded = n;
  QScopedValueRollback<bool>::QScopedValueRollback
            ((QScopedValueRollback<bool> *)CONCAT44(1,in_stack_ffffffffffffffb0),
             (bool *)in_stack_ffffffffffffffa8,SUB81((ulong)in_RDI >> 0x38,0));
  QTextCursor::beginEditBlock((QTextCursor *)CONCAT44(uVar2,in_stack_ffffffffffffffb0));
  charsRemoved = QTextCursor::position(in_stack_ffffffffffffffa8);
  from_00 = 0;
  QTextCursor::movePosition(this_01,(MoveOperation)((ulong)puVar3 >> 0x20),(MoveMode)puVar3,n);
  QTextCursor::position(in_stack_ffffffffffffffa8);
  reformatBlocks(this_00,from_00,charsRemoved,charsAdded);
  QTextCursor::endEditBlock((QTextCursor *)CONCAT44(uVar2,in_stack_ffffffffffffffb0));
  QScopedValueRollback<bool>::~QScopedValueRollback((QScopedValueRollback<bool> *)this_00);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

inline void rehighlight(QTextCursor &cursor, QTextCursor::MoveOperation operation)
    {
        QScopedValueRollback<bool> bg(inReformatBlocks, true);
        cursor.beginEditBlock();
        int from = cursor.position();
        cursor.movePosition(operation);
        reformatBlocks(from, 0, cursor.position() - from);
        cursor.endEditBlock();
    }